

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_Env_Test::TestBody(TApp_Env_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  char *pcVar3;
  App *this_00;
  AssertHelper local_198;
  Message local_190 [2];
  RequiredError *anon_var_0;
  char *pcStack_178;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  size_t local_138;
  unsigned_long local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  Option *local_78;
  Option *vopt;
  int val;
  allocator local_31;
  string local_30;
  TApp_Env_Test *local_10;
  TApp_Env_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"CLI11_TEST_ENV_TMP",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&val,"2",(allocator *)((long)&vopt + 7));
  put_env(&local_30,(string *)&val);
  std::__cxx11::string::~string((string *)&val);
  std::allocator<char>::~allocator((allocator<char> *)((long)&vopt + 7));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  vopt._0_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"--tmp",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  pOVar2 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (&(this->super_TApp).app,&local_98,(int *)&vopt,&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"CLI11_TEST_ENV_TMP",
             (allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  pOVar2 = CLI::Option::envname(pOVar2,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_78 = pOVar2;
  TApp::run(&this->super_TApp);
  local_104 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_100,"2","val",&local_104,(int *)&vopt);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x48b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_130 = 1;
  local_138 = CLI::Option::count(local_78);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_128,"(size_t)1","vopt->count()",&local_130,&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x48c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  this_00 = &(this->super_TApp).app;
  CLI::App::reset(this_00);
  CLI::OptionBase<CLI::Option>::required(&local_78->super_OptionBase<CLI::Option>,true);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"CLI11_TEST_ENV_TMP",(allocator *)((long)&gtest_msg.value + 7));
  unset_env(&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe88,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe88);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_178 = 
    "Expected: run() throws an exception of type CLI::RequiredError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_190);
  testing::internal::AssertHelper::AssertHelper
            (&local_198,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x494,pcStack_178);
  testing::internal::AssertHelper::operator=(&local_198,local_190);
  testing::internal::AssertHelper::~AssertHelper(&local_198);
  testing::Message::~Message(local_190);
  return;
}

Assistant:

TEST_F(TApp, Env) {

    put_env("CLI11_TEST_ENV_TMP", "2");

    int val = 1;
    CLI::Option *vopt = app.add_option("--tmp", val)->envname("CLI11_TEST_ENV_TMP");

    run();

    EXPECT_EQ(2, val);
    EXPECT_EQ((size_t)1, vopt->count());

    app.reset();
    vopt->required();
    run();

    app.reset();
    unset_env("CLI11_TEST_ENV_TMP");
    EXPECT_THROW(run(), CLI::RequiredError);
}